

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_evalScript(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val1;
  JSValue v;
  JSValue JVar1;
  int iVar2;
  JSRuntime *pJVar3;
  void *pvVar4;
  char *pcVar5;
  int in_ECX;
  JSContext *in_RDI;
  long in_R8;
  JSValue JVar6;
  int flags;
  BOOL backtrace_barrier;
  JSValue options_obj;
  JSValue ret;
  size_t len;
  char *str;
  JSThreadState *ts;
  JSRuntime *rt;
  size_t *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar7;
  int iVar8;
  char *in_stack_ffffffffffffff88;
  JSContext *in_stack_ffffffffffffff90;
  JSContext *in_stack_ffffffffffffff98;
  JSValueUnion JVar9;
  JSValueUnion in_stack_ffffffffffffffa0;
  int64_t in_stack_ffffffffffffffa8;
  int32_t local_10;
  undefined4 uStack_c;
  char *local_8;
  
  pJVar3 = JS_GetRuntime(in_RDI);
  pvVar4 = JS_GetRuntimeOpaque(pJVar3);
  iVar8 = 0;
  if (1 < in_ECX) {
    in_stack_ffffffffffffff88 = *(char **)(in_R8 + 0x10);
    in_stack_ffffffffffffff90 = *(JSContext **)(in_R8 + 0x18);
    JVar6.tag = in_stack_ffffffffffffffa8;
    JVar6.u.float64 = in_stack_ffffffffffffffa0.float64;
    iVar2 = get_bool_option(in_stack_ffffffffffffff98,(BOOL *)in_stack_ffffffffffffff90,JVar6,
                            in_stack_ffffffffffffff88);
    if (iVar2 != 0) {
      local_10 = 0;
      local_8 = (char *)0x6;
      goto LAB_00110864;
    }
  }
  val1.tag._0_4_ = in_stack_ffffffffffffff80;
  val1.u.ptr = in_stack_ffffffffffffff78;
  val1.tag._4_4_ = iVar8;
  pcVar5 = JS_ToCStringLen((JSContext *)
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           in_stack_ffffffffffffff68,val1);
  if (pcVar5 == (char *)0x0) {
    local_10 = 0;
    local_8 = (char *)0x6;
  }
  else {
    if ((*(long *)((long)pvVar4 + 0x48) == 0) &&
       (iVar2 = *(int *)((long)pvVar4 + 0x40) + 1, *(int *)((long)pvVar4 + 0x40) = iVar2, iVar2 == 1
       )) {
      pJVar3 = JS_GetRuntime(in_RDI);
      JS_SetInterruptHandler(pJVar3,interrupt_handler,(void *)0x0);
    }
    uVar7 = 0;
    if (iVar8 != 0) {
      uVar7 = 0x40;
    }
    JVar6 = JS_Eval(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,CONCAT44(iVar8,uVar7),
                    in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
    local_8 = (char *)JVar6.tag;
    JVar9 = JVar6.u;
    JS_FreeCString((JSContext *)CONCAT44(iVar8,uVar7),local_8);
    if ((*(long *)((long)pvVar4 + 0x48) == 0) &&
       (iVar8 = *(int *)((long)pvVar4 + 0x40) + -1, *(int *)((long)pvVar4 + 0x40) = iVar8,
       iVar8 == 0)) {
      pJVar3 = JS_GetRuntime(in_RDI);
      JS_SetInterruptHandler(pJVar3,(JSInterruptHandler *)0x0,(void *)0x0);
      os_pending_signals = os_pending_signals & 0xfffffffffffffffb;
      v.tag = (int64_t)local_8;
      v.u.float64 = JVar9.float64;
      iVar8 = JS_IsException(v);
      if (iVar8 != 0) {
        JS_ResetUncatchableError((JSContext *)0x110848);
      }
    }
    local_10 = JVar9.int32;
    uStack_c = JVar9._4_4_;
  }
LAB_00110864:
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = (int64_t)local_8;
  return JVar1;
}

Assistant:

static JSValue js_evalScript(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    JSRuntime *rt = JS_GetRuntime(ctx);
    JSThreadState *ts = JS_GetRuntimeOpaque(rt);
    const char *str;
    size_t len;
    JSValue ret;
    JSValueConst options_obj;
    BOOL backtrace_barrier = FALSE;
    int flags;
    
    if (argc >= 2) {
        options_obj = argv[1];
        if (get_bool_option(ctx, &backtrace_barrier, options_obj,
                            "backtrace_barrier"))
            return JS_EXCEPTION;
    }

    str = JS_ToCStringLen(ctx, &len, argv[0]);
    if (!str)
        return JS_EXCEPTION;
    if (!ts->recv_pipe && ++ts->eval_script_recurse == 1) {
        /* install the interrupt handler */
        JS_SetInterruptHandler(JS_GetRuntime(ctx), interrupt_handler, NULL);
    }
    flags = JS_EVAL_TYPE_GLOBAL; 
    if (backtrace_barrier)
        flags |= JS_EVAL_FLAG_BACKTRACE_BARRIER;
    ret = JS_Eval(ctx, str, len, "<evalScript>", flags);
    JS_FreeCString(ctx, str);
    if (!ts->recv_pipe && --ts->eval_script_recurse == 0) {
        /* remove the interrupt handler */
        JS_SetInterruptHandler(JS_GetRuntime(ctx), NULL, NULL);
        os_pending_signals &= ~((uint64_t)1 << SIGINT);
        /* convert the uncatchable "interrupted" error into a normal error
           so that it can be caught by the REPL */
        if (JS_IsException(ret))
            JS_ResetUncatchableError(ctx);
    }
    return ret;
}